

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

ssize_t __thiscall
Server::Private::ClientImpl::read(ClientImpl *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 in_register_00000034;
  int in_R8D;
  ClientImpl *local_40;
  ssize_t local_38;
  ssize received;
  usize *size_local;
  usize maxSize_local;
  byte *buffer_local;
  ClientImpl *this_local;
  
  maxSize_local = CONCAT44(in_register_00000034,__fd);
  received = __nbytes;
  size_local = (usize *)__buf;
  buffer_local = (byte *)this;
  local_38 = Socket::recv(&this->super_Socket,__fd,__buf,0,in_R8D);
  if (local_38 == -1) {
    iVar1 = Socket::getLastError();
    if (iVar1 == 0) {
      *(undefined8 *)received = 0;
      this_local._7_1_ = 0;
      goto LAB_001221ab;
    }
  }
  else if (local_38 != 0) {
    *(ssize_t *)received = local_38;
    this_local._7_1_ = 1;
    goto LAB_001221ab;
  }
  local_40 = this;
  HashSet<Server::Private::ClientImpl_*>::append(&this->_p->_closingClients,&local_40);
  *(undefined8 *)received = 0;
  this_local._7_1_ = 0;
LAB_001221ab:
  return CONCAT71((int7)((ulong)received >> 8),this_local._7_1_);
}

Assistant:

bool Server::Private::ClientImpl::read(byte *buffer, usize maxSize, usize &size)
{
  ssize received = recv(buffer, maxSize);
  switch (received)
  {
  case -1:
    if (Socket::getLastError() == 0) // EWOULDBLOCK
    {
      size = 0;
      return false;
    }
    // no break
  case 0:
    _p._closingClients.append(this);
    size = 0;
    return false;
  default:
    break;
  }
  size = (usize)received;
  return true;
}